

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_tools.cpp
# Opt level: O3

bool __thiscall
ON_Brep::RemoveNesting(ON_Brep *this,bool bExtractSingleSegments,bool bEdges,bool bTrimCurves)

{
  bool bVar1;
  ON_PolyCurve *pOVar2;
  undefined3 in_register_00000011;
  long lVar3;
  long lVar4;
  bool bVar5;
  
  if ((CONCAT31(in_register_00000011,bEdges) == 0) ||
     (lVar4 = (long)(this->m_C3).super_ON_SimpleArray<ON_Curve_*>.m_count, lVar4 < 1)) {
    bVar5 = false;
  }
  else {
    lVar3 = 0;
    bVar5 = false;
    do {
      pOVar2 = ON_PolyCurve::Cast((ON_Object *)
                                  (this->m_C3).super_ON_SimpleArray<ON_Curve_*>.m_a[lVar3]);
      if (pOVar2 != (ON_PolyCurve *)0x0) {
        bVar1 = ON_PolyCurve::RemoveNesting(pOVar2);
        bVar5 = (bool)(bVar1 | bVar5);
        if (bExtractSingleSegments) {
          ON_PolyCurve::Count(pOVar2);
        }
      }
      lVar3 = lVar3 + 1;
    } while (lVar4 != lVar3);
  }
  if ((bTrimCurves) &&
     (lVar4 = (long)(this->m_C2).super_ON_SimpleArray<ON_Curve_*>.m_count, 0 < lVar4)) {
    lVar3 = 0;
    do {
      pOVar2 = ON_PolyCurve::Cast((ON_Object *)
                                  (this->m_C2).super_ON_SimpleArray<ON_Curve_*>.m_a[lVar3]);
      if (pOVar2 != (ON_PolyCurve *)0x0) {
        bVar1 = ON_PolyCurve::RemoveNesting(pOVar2);
        bVar5 = (bool)(bVar1 | bVar5);
        if (bExtractSingleSegments) {
          ON_PolyCurve::Count(pOVar2);
        }
      }
      lVar3 = lVar3 + 1;
    } while (lVar4 != lVar3);
  }
  return bVar5;
}

Assistant:

bool ON_Brep::RemoveNesting(
        bool bExtractSingleSegments,
        bool bEdges, 
        bool bTrimCurves
        )
{
  bool rc = false;
  // TODO
  int i, count;
  ON_PolyCurve* polycurve;

  if ( bEdges )
  {
    count = m_C3.Count();
    for ( i = 0; i < count; i++ )
    {
      polycurve = ON_PolyCurve::Cast(m_C3[i]);
      if ( 0 != polycurve )
      {
        if ( polycurve->RemoveNesting() )
          rc = true;
        if ( bExtractSingleSegments && 1 == polycurve->Count() )
        {
          // TODO - extract segment and update edge's proxy information
        }
      }
    }
  }

  if ( bTrimCurves )
  {
    count = m_C2.Count();
    for ( i = 0; i < count; i++ )
    {
      polycurve = ON_PolyCurve::Cast(m_C2[i]);
      if ( 0 != polycurve )
      {
        if ( polycurve->RemoveNesting() )
          rc = true;
        if ( bExtractSingleSegments && 1 == polycurve->Count() )
        {
          // TODO - extract segment and update trims's proxy information
        }
      }
    }
  }

  return rc;
}